

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

MergeResult
mergesort_lcp_3way<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  lcp_t lVar1;
  ulong uVar2;
  ulong n_00;
  double dVar3;
  undefined1 auVar4 [16];
  MergeResult local_6c;
  MergeResult local_68;
  MergeResult m2;
  MergeResult m1;
  MergeResult m0;
  size_t split1;
  size_t split0;
  uint i;
  size_t n_local;
  lcp_t *lcp_output_local;
  lcp_t *lcp_input_local;
  uchar **strings_output_local;
  uchar **strings_input_local;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,0);
    for (split0._4_4_ = 0; (ulong)split0._4_4_ < n - 1; split0._4_4_ = split0._4_4_ + 1) {
      lVar1 = lcp(strings_input[split0._4_4_],strings_input[split0._4_4_ + 1]);
      lcp_input[split0._4_4_] = lVar1;
    }
    strings_input_local._4_4_ = SortedInPlace;
  }
  else {
    n_00 = n / 3;
    auVar4._8_4_ = (int)(n >> 0x20);
    auVar4._0_8_ = n;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
    uVar2 = (ulong)dVar3;
    uVar2 = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    m2 = mergesort_lcp_3way<true>(strings_input,strings_output,lcp_input,lcp_output,n_00);
    if (m2 == SortedInPlace) {
      check_input(strings_input,lcp_input,n_00);
    }
    else {
      check_input(strings_output,lcp_output,n_00);
    }
    local_68 = mergesort_lcp_3way<true>
                         (strings_input + n_00,strings_output + n_00,lcp_input + n_00,
                          lcp_output + n_00,uVar2 - n_00);
    if (local_68 == SortedInPlace) {
      check_input(strings_input + n_00,lcp_input + n_00,uVar2 - n_00);
    }
    else {
      check_input(strings_output + n_00,lcp_output + n_00,uVar2 - n_00);
    }
    local_6c = mergesort_lcp_3way<true>
                         (strings_input + uVar2,strings_output + uVar2,lcp_input + uVar2,
                          lcp_output + uVar2,n - uVar2);
    if (local_6c == SortedInPlace) {
      check_input(strings_input + uVar2,lcp_input + uVar2,n - uVar2);
    }
    else {
      check_input(strings_output + uVar2,lcp_output + uVar2,n - uVar2);
    }
    if (m2 != local_68) {
      if (local_68 == local_6c) {
        if (m2 != SortedInPlace) {
          std::copy<unsigned_char**,unsigned_char**>
                    (strings_output,strings_output + n_00,strings_input);
          std::copy<unsigned_long*,unsigned_long*>(lcp_output,lcp_output + n_00,lcp_input);
        }
        else {
          std::copy<unsigned_char**,unsigned_char**>
                    (strings_input,strings_input + n_00,strings_output);
          std::copy<unsigned_long*,unsigned_long*>(lcp_input,lcp_input + n_00,lcp_output);
        }
        m2 = (MergeResult)(m2 == SortedInPlace);
      }
      else {
        if (local_68 != SortedInPlace) {
          std::copy<unsigned_char**,unsigned_char**>
                    (strings_output + n_00,strings_output + uVar2,strings_input + n_00);
          std::copy<unsigned_long*,unsigned_long*>
                    (lcp_output + n_00,lcp_output + uVar2,lcp_input + n_00);
        }
        else {
          std::copy<unsigned_char**,unsigned_char**>
                    (strings_input + n_00,strings_input + uVar2,strings_output + n_00);
          std::copy<unsigned_long*,unsigned_long*>
                    (lcp_input + n_00,lcp_input + uVar2,lcp_output + n_00);
        }
        local_68 = (MergeResult)(local_68 == SortedInPlace);
      }
    }
    if (local_68 != local_6c) {
      if (local_6c != SortedInPlace) {
        std::copy<unsigned_char**,unsigned_char**>
                  (strings_output + uVar2,strings_output + n,strings_input + uVar2);
        std::copy<unsigned_long*,unsigned_long*>
                  (lcp_output + uVar2,lcp_output + n,lcp_input + uVar2);
      }
      else {
        std::copy<unsigned_char**,unsigned_char**>
                  (strings_input + uVar2,strings_input + n,strings_output + uVar2);
        std::copy<unsigned_long*,unsigned_long*>(lcp_input + uVar2,lcp_input + n,lcp_output + uVar2)
        ;
      }
      local_6c = (MergeResult)(local_6c == SortedInPlace);
    }
    if (m2 != local_68) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x31d,
                    "MergeResult mergesort_lcp_3way(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                   );
    }
    if (local_68 != local_6c) {
      __assert_fail("m1 == m2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x31d,
                    "MergeResult mergesort_lcp_3way(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                   );
    }
    if (m2 == SortedInPlace) {
      merge_lcp_3way<false>
                (strings_input,lcp_input,n_00,strings_input + n_00,lcp_input + n_00,uVar2 - n_00,
                 strings_input + uVar2,lcp_input + uVar2,n - uVar2,strings_output,lcp_output);
      strings_input_local._4_4_ = SortedInTemp;
    }
    else {
      merge_lcp_3way<false>
                (strings_output,lcp_output,n_00,strings_output + n_00,lcp_output + n_00,uVar2 - n_00
                 ,strings_output + uVar2,lcp_output + uVar2,n - uVar2,strings_input,lcp_input);
      strings_input_local._4_4_ = SortedInPlace;
    }
  }
  return strings_input_local._4_4_;
}

Assistant:

MergeResult
mergesort_lcp_3way(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0 = mergesort_lcp_3way<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
	debug() << __func__ << "(): checking first merge\n";
	if (m0 == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);
	MergeResult m1 = mergesort_lcp_3way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
	debug() << __func__ << "(): checking second merge\n";
	if (m1 == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  split1-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, split1-split0);
	MergeResult m2 = mergesort_lcp_3way<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
	debug() << __func__ << "(): checking third merge\n";
	if (m2 == SortedInPlace) check_input(strings_input+split1,  lcp_input+split1,  n-split1);
	else                     check_input(strings_output+split1, lcp_output+split1, n-split1);
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}